

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O0

Card ** cards_createDeck(uchar decksCount)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  Card **ppCVar4;
  Card *pCVar5;
  byte in_DIL;
  Card **cards;
  uchar d;
  uchar i;
  _Bool faceUp;
  SUIT suit;
  int in_stack_ffffffffffffff64;
  uchar rank;
  byte local_3;
  byte local_2;
  
  ppCVar4 = (Card **)malloc((long)(int)((uint)in_DIL * 0x34) << 3);
  local_3 = 0;
  do {
    if (in_DIL <= local_3) {
      return ppCVar4;
    }
    for (local_2 = 1; local_2 < 0xe; local_2 = local_2 + 1) {
      rank = (uchar)((uint)in_stack_ffffffffffffff64 >> 0x18);
      suit = (SUIT)((uint)in_stack_ffffffffffffff64 >> 0x10);
      faceUp = SUB41((uint)in_stack_ffffffffffffff64 >> 8,0);
      pCVar5 = card_create(rank,suit,faceUp);
      if (SBORROW4((uint)local_2,1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      lVar1 = (long)(int)(local_2 - 1) * 4;
      iVar3 = (int)lVar1;
      if (iVar3 != lVar1) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if (SCARRY4(iVar3,(uint)local_3 * 0x34)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppCVar4[(int)(iVar3 + (uint)local_3 * 0x34)] = pCVar5;
      pCVar5 = card_create(rank,suit,faceUp);
      if (SBORROW4((uint)local_2,1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      lVar1 = (long)(int)(local_2 - 1) * 4;
      iVar3 = (int)lVar1;
      if (iVar3 != lVar1) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if (SCARRY4(iVar3,1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if (SCARRY4(iVar3 + 1,(uint)local_3 * 0x34)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppCVar4[(int)(iVar3 + 1 + (uint)local_3 * 0x34)] = pCVar5;
      pCVar5 = card_create(rank,suit,faceUp);
      if (SBORROW4((uint)local_2,1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      lVar1 = (long)(int)(local_2 - 1) * 4;
      iVar3 = (int)lVar1;
      if (iVar3 != lVar1) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if (SCARRY4(iVar3,2)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if (SCARRY4(iVar3 + 2,(uint)local_3 * 0x34)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppCVar4[(int)(iVar3 + 2 + (uint)local_3 * 0x34)] = pCVar5;
      pCVar5 = card_create(rank,suit,faceUp);
      if (SBORROW4((uint)local_2,1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      lVar1 = (long)(int)(local_2 - 1) * 4;
      in_stack_ffffffffffffff64 = (int)lVar1;
      if (in_stack_ffffffffffffff64 != lVar1) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if (SCARRY4(in_stack_ffffffffffffff64,3)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if (SCARRY4(in_stack_ffffffffffffff64 + 3,(uint)local_3 * 0x34)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppCVar4[(int)(in_stack_ffffffffffffff64 + 3 + (uint)local_3 * 0x34)] = pCVar5;
    }
    local_3 = local_3 + 1;
  } while( true );
}

Assistant:

Card ** cards_createDeck(unsigned char decksCount)
{
	unsigned char i, d;
	Card ** cards = (Card **)malloc(sizeof(Card *)*(52*decksCount));

	for(d=0;d<decksCount;d++)
	{
		for(i=1;i<=13;i++)
		{
			cards[((i-1)*4)+(d*52)] = card_create(i, CLUB, true);
			cards[((i-1)*4)+1+(d*52)] = card_create(i, DIAMOND, true);
			cards[((i-1)*4)+2+(d*52)] = card_create(i, HEART, true);
			cards[((i-1)*4)+3+(d*52)] = card_create(i, SPADE, true);
		}
	}

	return cards;
}